

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_avx2.c
# Opt level: O0

void iidentity_col_16xn_avx2
               (uint8_t *output,int stride,__m256i *buf,int shift,int height,int txh_idx)

{
  ushort uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  __m256i res;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  uint uVar13;
  int in_ECX;
  long in_RDX;
  int in_R8D;
  int in_R9D;
  __m256i x;
  __m256i hi;
  __m256i lo;
  int h;
  __m256i scale_coeff;
  __m256i one;
  __m256i shift__r;
  __m256i scale__r;
  __m256i scale;
  int local_564;
  byte local_49c;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 uStack_270;
  undefined8 uStack_268;
  
  uVar1 = *(ushort *)(NewSqrt2list + in_R9D);
  auVar3 = vpinsrw_avx(ZEXT216(uVar1),(uint)uVar1,1);
  auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,2);
  auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,3);
  auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,4);
  auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,5);
  auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,6);
  auVar4 = vpinsrw_avx(auVar3,(uint)uVar1,7);
  auVar3 = vpinsrw_avx(ZEXT216(uVar1),(uint)uVar1,1);
  auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,2);
  auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,3);
  auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,4);
  auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,5);
  auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,6);
  auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,7);
  uStack_350 = auVar3._0_8_;
  uStack_348 = auVar3._8_8_;
  auVar3 = vpinsrw_avx(ZEXT216(0x800),0x800,1);
  auVar3 = vpinsrw_avx(auVar3,0x800,2);
  auVar3 = vpinsrw_avx(auVar3,0x800,3);
  auVar3 = vpinsrw_avx(auVar3,0x800,4);
  auVar3 = vpinsrw_avx(auVar3,0x800,5);
  auVar3 = vpinsrw_avx(auVar3,0x800,6);
  auVar5 = vpinsrw_avx(auVar3,0x800,7);
  auVar3 = vpinsrw_avx(ZEXT216(0x800),0x800,1);
  auVar3 = vpinsrw_avx(auVar3,0x800,2);
  auVar3 = vpinsrw_avx(auVar3,0x800,3);
  auVar3 = vpinsrw_avx(auVar3,0x800,4);
  auVar3 = vpinsrw_avx(auVar3,0x800,5);
  auVar3 = vpinsrw_avx(auVar3,0x800,6);
  auVar3 = vpinsrw_avx(auVar3,0x800,7);
  uStack_310 = auVar3._0_8_;
  uStack_308 = auVar3._8_8_;
  local_49c = (byte)in_ECX;
  uVar13 = 1 << (~local_49c & 0x1f);
  auVar3 = vpinsrd_avx(ZEXT416(uVar13),uVar13,1);
  auVar3 = vpinsrd_avx(auVar3,uVar13,2);
  auVar3 = vpinsrd_avx(auVar3,uVar13,3);
  auVar2 = vpinsrd_avx(ZEXT416(uVar13),uVar13,1);
  auVar2 = vpinsrd_avx(auVar2,uVar13,2);
  auVar2 = vpinsrd_avx(auVar2,uVar13,3);
  uStack_270 = auVar2._0_8_;
  uStack_268 = auVar2._8_8_;
  auVar2 = vpinsrw_avx(ZEXT216(1),1,1);
  auVar2 = vpinsrw_avx(auVar2,1,2);
  auVar2 = vpinsrw_avx(auVar2,1,3);
  auVar2 = vpinsrw_avx(auVar2,1,4);
  auVar2 = vpinsrw_avx(auVar2,1,5);
  auVar2 = vpinsrw_avx(auVar2,1,6);
  auVar2 = vpinsrw_avx(auVar2,1,7);
  auVar6 = vpinsrw_avx(ZEXT216(1),1,1);
  auVar6 = vpinsrw_avx(auVar6,1,2);
  auVar6 = vpinsrw_avx(auVar6,1,3);
  auVar6 = vpinsrw_avx(auVar6,1,4);
  auVar6 = vpinsrw_avx(auVar6,1,5);
  auVar6 = vpinsrw_avx(auVar6,1,6);
  auVar6 = vpinsrw_avx(auVar6,1,7);
  uStack_2d0 = auVar6._0_8_;
  uStack_2c8 = auVar6._8_8_;
  auVar9._16_8_ = uStack_350;
  auVar9._0_16_ = auVar4;
  auVar9._24_8_ = uStack_348;
  auVar8._16_8_ = uStack_310;
  auVar8._0_16_ = auVar5;
  auVar8._24_8_ = uStack_308;
  auVar8 = vpunpcklwd_avx2(auVar9,auVar8);
  for (local_564 = 0; local_564 < in_R8D; local_564 = local_564 + 1) {
    auVar7._16_8_ = uStack_2d0;
    auVar7._0_16_ = auVar2;
    auVar7._24_8_ = uStack_2c8;
    auVar9 = vpunpcklwd_avx2(*(undefined1 (*) [32])(in_RDX + (long)local_564 * 0x20),auVar7);
    auVar10._16_8_ = uStack_2d0;
    auVar10._0_16_ = auVar2;
    auVar10._24_8_ = uStack_2c8;
    auVar7 = vpunpckhwd_avx2(*(undefined1 (*) [32])(in_RDX + (long)local_564 * 0x20),auVar10);
    auVar9 = vpmaddwd_avx2(auVar9,auVar8);
    auVar7 = vpmaddwd_avx2(auVar7,auVar8);
    auVar9 = vpsrad_avx2(auVar9,ZEXT416(0xc));
    auVar7 = vpsrad_avx2(auVar7,ZEXT416(0xc));
    auVar12._16_8_ = uStack_270;
    auVar12._0_16_ = auVar3;
    auVar12._24_8_ = uStack_268;
    auVar9 = vpaddd_avx2(auVar9,auVar12);
    auVar11._16_8_ = uStack_270;
    auVar11._0_16_ = auVar3;
    auVar11._24_8_ = uStack_268;
    auVar7 = vpaddd_avx2(auVar7,auVar11);
    auVar9 = vpsrad_avx2(auVar9,ZEXT416((uint)-in_ECX));
    auVar7 = vpsrad_avx2(auVar7,ZEXT416((uint)-in_ECX));
    vpackssdw_avx2(auVar9,auVar7);
    res[1] = auVar9._0_8_;
    res[0] = auVar7._24_8_;
    res[2] = auVar9._8_8_;
    res[3] = auVar9._16_8_;
    write_recon_w16_avx2(res,auVar7._16_8_);
  }
  return;
}

Assistant:

static inline void iidentity_col_16xn_avx2(uint8_t *output, int stride,
                                           __m256i *buf, int shift, int height,
                                           int txh_idx) {
  const __m256i scale = _mm256_set1_epi16(NewSqrt2list[txh_idx]);
  const __m256i scale__r = _mm256_set1_epi16(1 << (NewSqrt2Bits - 1));
  const __m256i shift__r = _mm256_set1_epi32(1 << (-shift - 1));
  const __m256i one = _mm256_set1_epi16(1);
  const __m256i scale_coeff = _mm256_unpacklo_epi16(scale, scale__r);
  for (int h = 0; h < height; ++h) {
    __m256i lo = _mm256_unpacklo_epi16(buf[h], one);
    __m256i hi = _mm256_unpackhi_epi16(buf[h], one);
    lo = _mm256_madd_epi16(lo, scale_coeff);
    hi = _mm256_madd_epi16(hi, scale_coeff);
    lo = _mm256_srai_epi32(lo, NewSqrt2Bits);
    hi = _mm256_srai_epi32(hi, NewSqrt2Bits);
    lo = _mm256_add_epi32(lo, shift__r);
    hi = _mm256_add_epi32(hi, shift__r);
    lo = _mm256_srai_epi32(lo, -shift);
    hi = _mm256_srai_epi32(hi, -shift);
    const __m256i x = _mm256_packs_epi32(lo, hi);
    write_recon_w16_avx2(x, output);
    output += stride;
  }
}